

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

Maybe<kj::Array<char>_> *
kj::parse::
Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'\\'>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'x'>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>
::Impl<kj::parse::IteratorInput<char,_const_char_*>,_char>::apply
          (Maybe<kj::Array<char>_> *__return_storage_ptr__,
          OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__x_>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>
          *subParser,IteratorInput<char,_const_char_*> *input)

{
  OneOf_<kj::parse::CharGroup_,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)92>,kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,kj::parse::_::InterpretEscape>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)120>,kj::parse::CharGroup_const&,kj::parse::CharGroup_const&>,kj::parse::_::ParseHexEscape>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_const&,kj::parse::Optional_<kj::parse::CharGroup_const&>,kj::parse::Optional_<kj::parse::CharGroup_const&>>,kj::parse::_::ParseOctEscape>>>const&>
  OVar1;
  char cVar2;
  char *pcVar3;
  size_t newSize;
  IteratorInput<char,_const_char_*> subInput;
  OneOf_<kj::parse::CharGroup_,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)92>,kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,kj::parse::_::InterpretEscape>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)120>,kj::parse::CharGroup_const&,kj::parse::CharGroup_const&>,kj::parse::_::ParseHexEscape>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_const&,kj::parse::Optional_<kj::parse::CharGroup_const&>,kj::parse::Optional_<kj::parse::CharGroup_const&>>,kj::parse::_::ParseOctEscape>>>const&>
  local_7a;
  char local_79;
  Vector<char> local_78;
  IteratorInput<char,_const_char_*> *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  Maybe<kj::Array<char>_> *local_38;
  
  local_78.builder.ptr = (char *)0x0;
  local_78.builder.pos = (char *)0x0;
  local_78.builder.endPtr = (char *)0x0;
  local_38 = __return_storage_ptr__;
  do {
    pcVar3 = input->pos;
    if (pcVar3 == input->end) break;
    local_58 = input;
    local_50 = pcVar3;
    local_48 = input->end;
    local_40 = pcVar3;
    OneOf_<kj::parse::CharGroup_,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)92>,kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,kj::parse::_::InterpretEscape>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)120>,kj::parse::CharGroup_const&,kj::parse::CharGroup_const&>,kj::parse::_::ParseHexEscape>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_const&,kj::parse::Optional_<kj::parse::CharGroup_const&>,kj::parse::Optional_<kj::parse::CharGroup_const&>>,kj::parse::_::ParseOctEscape>>>const&>
    ::operator()(&local_7a,(IteratorInput<char,_const_char_*> *)subParser);
    cVar2 = local_79;
    OVar1 = local_7a;
    if (local_7a ==
        (OneOf_<kj::parse::CharGroup_,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)92>,kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,kj::parse::_::InterpretEscape>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)120>,kj::parse::CharGroup_const&,kj::parse::CharGroup_const&>,kj::parse::_::ParseHexEscape>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_const&,kj::parse::Optional_<kj::parse::CharGroup_const&>,kj::parse::Optional_<kj::parse::CharGroup_const&>>,kj::parse::_::ParseOctEscape>>>const&>
         )0x1) {
      local_58->pos = local_50;
      if (local_78.builder.pos == local_78.builder.endPtr) {
        newSize = ((long)local_78.builder.pos - (long)local_78.builder.ptr) * 2;
        if (local_78.builder.pos == local_78.builder.ptr) {
          newSize = 4;
        }
        Vector<char>::setCapacity(&local_78,newSize);
      }
      *local_78.builder.pos = cVar2;
      local_78.builder.pos = local_78.builder.pos + 1;
    }
    if (local_58 != (IteratorInput<char,_const_char_*> *)0x0) {
      pcVar3 = local_40;
      if (local_40 < local_50) {
        pcVar3 = local_50;
      }
      if (pcVar3 <= local_58->best) {
        pcVar3 = local_58->best;
      }
      local_58->best = pcVar3;
    }
  } while (OVar1 != (OneOf_<kj::parse::CharGroup_,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)92>,kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,kj::parse::_::InterpretEscape>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)120>,kj::parse::CharGroup_const&,kj::parse::CharGroup_const&>,kj::parse::_::ParseHexEscape>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_const&,kj::parse::Optional_<kj::parse::CharGroup_const&>,kj::parse::Optional_<kj::parse::CharGroup_const&>>,kj::parse::_::ParseOctEscape>>>const&>
                     )0x0);
  if (local_78.builder.pos != local_78.builder.endPtr) {
    Vector<char>::setCapacity(&local_78,(long)local_78.builder.pos - (long)local_78.builder.ptr);
  }
  (local_38->ptr).isSet = true;
  (local_38->ptr).field_1.value.ptr = local_78.builder.ptr;
  (local_38->ptr).field_1.value.size_ = (long)local_78.builder.pos - (long)local_78.builder.ptr;
  (local_38->ptr).field_1.value.disposer = local_78.builder.disposer;
  return local_38;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_MAYBE(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(*subResult));
      } else {
        break;
      }
    }